

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  char cVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  long *in_RSI;
  Promise<void> PVar3;
  Own<kj::_::PromiseNode> intermediate;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_58;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  (**(code **)(*in_RSI + 0x18))(&intermediate);
  cVar1 = (char)intermediate.disposer;
  local_58.isSet = (bool)(char)intermediate.disposer;
  if ((char)intermediate.disposer == '\x01') {
    local_58.field_1.value.super_PromiseBase.node.disposer = (Disposer *)intermediate.ptr;
  }
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
            ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)&intermediate);
  if (cVar1 == '\0') {
    kj::Promise<void>::Promise((Promise<void> *)this);
  }
  else {
    this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&local_58.field_1.value,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::Own<capnp::ClientHook>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:93:26),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066d370;
    intermediate.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<capnp::ClientHook>,capnp::ClientHook::whenResolved()::$_0,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    kj::_::maybeChain<void>(&local_40,(Promise<void> *)&intermediate);
    pPVar2 = local_40.ptr;
    local_30.disposer = local_40.disposer;
    local_40.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_40);
    this->_vptr_ClientHook = (_func_int **)local_40.disposer;
    this[1]._vptr_ClientHook = (_func_int **)pPVar2;
    local_30.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_30);
    kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
  }
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue(&local_58);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_MAYBE(promise, whenMoreResolved()) {
    return promise->then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }